

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_naive_aggregator.cpp
# Opt level: O0

bool __thiscall duckdb::WindowNaiveState::KeyEqual(WindowNaiveState *this,idx_t *lidx,idx_t *ridx)

{
  bool bVar1;
  sel_t sVar2;
  pointer pWVar3;
  idx_t iVar4;
  idx_t *in_RDX;
  idx_t *in_RSI;
  Vector *in_RDI;
  Vector right;
  Vector left;
  column_t c;
  SelectionVector fsel;
  sel_t f;
  SelectionVector rsel;
  sel_t r;
  DataChunk *rscanned;
  pointer rreader;
  SelectionVector lsel;
  sel_t l;
  DataChunk *scanned;
  idx_t rhs;
  idx_t lhs;
  idx_t in_stack_fffffffffffffe08;
  WindowCursor *in_stack_fffffffffffffe10;
  sel_t *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *count;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  uint uVar6;
  optional_ptr<duckdb::SelectionVector,_true> in_stack_fffffffffffffe58;
  optional_ptr<duckdb::SelectionVector,_true> in_stack_fffffffffffffe60;
  optional_ptr<const_duckdb::SelectionVector,_true> in_stack_fffffffffffffe68;
  optional_ptr<const_duckdb::SelectionVector,_true> in_stack_fffffffffffffe70;
  ulong local_c0;
  SelectionVector local_b8;
  undefined4 local_9c;
  sel_t local_7c;
  DataChunk *local_78;
  pointer local_60;
  sel_t local_3c;
  DataChunk *local_38;
  idx_t local_30;
  idx_t local_28 [4];
  byte local_1;
  
  local_28[0] = *in_RSI;
  local_30 = *in_RDX;
  pWVar3 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator->((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                       *)in_stack_fffffffffffffe10);
  bVar1 = WindowCursor::RowIsVisible(pWVar3,local_28[0]);
  if (!bVar1) {
    std::swap<unsigned_long>(local_28,&local_30);
  }
  count = &(in_RDI->buffer).internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  pWVar3 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator->((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                       *)in_stack_fffffffffffffe10);
  local_38 = &pWVar3->chunk;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::operator->
            ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
             in_stack_fffffffffffffe10);
  local_3c = WindowCursor::RowOffset(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  SelectionVector::SelectionVector
            ((SelectionVector *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             in_stack_fffffffffffffe28);
  local_60 = ::std::unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>::
             get((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_> *)
                 in_stack_fffffffffffffe10);
  pWVar3 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator->((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                       *)in_stack_fffffffffffffe10);
  bVar1 = WindowCursor::RowIsVisible(pWVar3,local_30);
  uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe34);
  if (!bVar1) {
    local_60 = ::std::unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>::
               get((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_> *)
                   in_stack_fffffffffffffe10);
    WindowCursor::Seek(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  local_78 = &local_60->chunk;
  sVar2 = WindowCursor::RowOffset(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  local_7c = sVar2;
  SelectionVector::SelectionVector
            ((SelectionVector *)CONCAT44(uVar5,sVar2),in_stack_fffffffffffffe28);
  local_9c = 0;
  SelectionVector::SelectionVector
            ((SelectionVector *)CONCAT44(uVar5,sVar2),in_stack_fffffffffffffe28);
  for (local_c0 = 0; iVar4 = DataChunk::ColumnCount((DataChunk *)0x1a3fef6), local_c0 < iVar4;
      local_c0 = local_c0 + 1) {
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    Vector::Vector((Vector *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),in_RDI,
                   (SelectionVector *)pWVar3,(idx_t)count);
    in_stack_fffffffffffffe10 =
         (WindowCursor *)
         vector<duckdb::Vector,_true>::operator[]
                   ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe10,
                    in_stack_fffffffffffffe08);
    Vector::Vector((Vector *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),in_RDI,
                   (SelectionVector *)pWVar3,(idx_t)count);
    optional_ptr<const_duckdb::SelectionVector,_true>::optional_ptr
              ((optional_ptr<const_duckdb::SelectionVector,_true> *)&stack0xfffffffffffffe68,
               (SelectionVector *)0x0);
    optional_ptr<duckdb::SelectionVector,_true>::optional_ptr
              ((optional_ptr<duckdb::SelectionVector,_true> *)&stack0xfffffffffffffe60,
               (SelectionVector *)0x0);
    optional_ptr<duckdb::SelectionVector,_true>::optional_ptr
              ((optional_ptr<duckdb::SelectionVector,_true> *)&stack0xfffffffffffffe58,&local_b8);
    in_stack_fffffffffffffe08 =
         VectorOperations::NotDistinctFrom
                   ((Vector *)in_stack_fffffffffffffe58.ptr,
                    (Vector *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                    in_stack_fffffffffffffe70,(idx_t)in_RDI,
                    (optional_ptr<duckdb::SelectionVector,_true>)in_stack_fffffffffffffe68.ptr,
                    in_stack_fffffffffffffe60);
    if (in_stack_fffffffffffffe08 == 0) {
      local_1 = 0;
    }
    uVar6 = (uint)(in_stack_fffffffffffffe08 == 0);
    Vector::~Vector((Vector *)in_stack_fffffffffffffe10);
    Vector::~Vector((Vector *)in_stack_fffffffffffffe10);
    if (uVar6 != 0) goto LAB_01a400d7;
    in_stack_fffffffffffffe54 = 0;
  }
  local_1 = 1;
LAB_01a400d7:
  SelectionVector::~SelectionVector((SelectionVector *)0x1a400e4);
  SelectionVector::~SelectionVector((SelectionVector *)0x1a400f1);
  SelectionVector::~SelectionVector((SelectionVector *)0x1a400fe);
  return (bool)(local_1 & 1);
}

Assistant:

bool WindowNaiveState::KeyEqual(const idx_t &lidx, const idx_t &ridx) {
	//	One of the indices will be scanned, so make it the left one
	auto lhs = lidx;
	auto rhs = ridx;
	if (!cursor->RowIsVisible(lhs)) {
		std::swap(lhs, rhs);
		D_ASSERT(cursor->RowIsVisible(lhs));
	}

	auto &scanned = cursor->chunk;
	auto l = cursor->RowOffset(lhs);
	SelectionVector lsel(&l);

	auto rreader = cursor.get();
	if (!cursor->RowIsVisible(rhs)) {
		//	Values on different pages!
		rreader = comparer.get();
		rreader->Seek(rhs);
	}
	auto rscanned = &rreader->chunk;
	auto r = rreader->RowOffset(rhs);
	SelectionVector rsel(&r);

	sel_t f = 0;
	SelectionVector fsel(&f);

	for (column_t c = 0; c < scanned.ColumnCount(); ++c) {
		Vector left(scanned.data[c], lsel, 1);
		Vector right(rscanned->data[c], rsel, 1);
		if (!VectorOperations::NotDistinctFrom(left, right, nullptr, 1, nullptr, &fsel)) {
			return false;
		}
	}

	return true;
}